

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

size_t mpeg_bitstream_flush(mpeg_bitstream_t *packet,caption_frame_t *frame)

{
  libcaption_stauts_t lVar1;
  size_t sVar2;
  
  if (packet->latent != 0) {
    lVar1 = cea708_to_caption_frame(frame,packet->cea708 + ((uint)packet->front & 0x3f));
    packet->status = lVar1;
    packet->front = (ulong)((int)packet->front + 1U & 0x3f);
    sVar2 = packet->latent - 1;
    packet->latent = sVar2;
    return sVar2;
  }
  return 0;
}

Assistant:

size_t mpeg_bitstream_flush(mpeg_bitstream_t* packet, caption_frame_t* frame)
{
    if (packet->latent) {
        cea708_t* cea708 = _mpeg_bitstream_cea708_front(packet);
        packet->status = libcaption_status_update(LIBCAPTION_OK, cea708_to_caption_frame(frame, cea708));
        packet->front = (packet->front + 1) % MAX_REFRENCE_FRAMES;
        --packet->latent;
    }

    return packet->latent;
}